

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to8.h
# Opt level: O0

void ncnn::convolution_im2col_sgemm_transform_kernel_pack1to8_avx
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  int in_R8D;
  int in_R9D;
  int k;
  float *k70;
  float *k60;
  float *k50;
  float *k40;
  float *k30;
  float *k20;
  float *k10;
  float *k00;
  int p;
  float *g00;
  Mat k7;
  Mat k6;
  Mat k5;
  Mat k4;
  Mat k3;
  Mat k2;
  Mat k1;
  Mat k0;
  int q;
  Mat kernel;
  int maxk;
  Mat *m_8;
  Mat *m_7;
  Mat *m_6;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_fffffffffffff3b0;
  size_t in_stack_fffffffffffff3b8;
  undefined8 in_stack_fffffffffffff3c0;
  int _c;
  undefined8 in_stack_fffffffffffff3c8;
  Mat *in_stack_fffffffffffff3d0;
  Allocator *in_stack_fffffffffffff490;
  undefined8 in_stack_fffffffffffff498;
  undefined8 in_stack_fffffffffffff4a0;
  Mat *in_stack_fffffffffffff4a8;
  int local_ae4;
  int local_a9c;
  undefined8 local_a98;
  undefined8 local_a90;
  undefined8 local_a88;
  undefined4 local_a80;
  long local_a78;
  undefined4 local_a70;
  undefined4 local_a6c;
  undefined4 local_a68;
  undefined4 local_a64;
  undefined4 local_a60;
  undefined8 local_a58;
  undefined4 *local_a50;
  undefined8 local_a48;
  undefined8 local_a40;
  undefined8 local_a38;
  undefined4 local_a30;
  undefined4 local_a20;
  undefined4 local_a1c;
  undefined4 local_a18;
  undefined4 local_a14;
  undefined4 local_a10;
  undefined8 local_a08;
  undefined8 local_a00;
  undefined8 local_9f8;
  undefined8 local_9f0;
  undefined4 local_9e8;
  undefined4 local_9d8;
  undefined4 local_9d4;
  undefined4 local_9d0;
  undefined4 local_9cc;
  undefined4 local_9c8;
  undefined8 local_9c0;
  undefined8 local_9b8;
  undefined8 local_9b0;
  undefined4 local_990;
  undefined4 local_984;
  undefined8 local_978;
  undefined8 local_970;
  undefined8 local_968;
  undefined4 local_948;
  undefined4 local_93c;
  undefined8 local_930;
  undefined8 local_928;
  undefined8 local_920;
  undefined4 local_900;
  undefined4 local_8f4;
  undefined8 local_8e8;
  undefined8 local_8e0;
  undefined8 local_8d8;
  undefined4 local_8b8;
  undefined4 local_8ac;
  undefined8 local_8a0;
  undefined8 local_898;
  undefined8 local_890;
  undefined4 local_870;
  undefined4 local_864;
  undefined8 local_858;
  undefined8 local_850;
  undefined8 local_848;
  undefined8 local_840;
  undefined4 local_838;
  undefined4 local_828;
  undefined4 local_824;
  undefined4 local_820;
  undefined4 local_81c;
  undefined4 local_818;
  undefined8 local_810;
  int local_808;
  void *local_7f8;
  int *local_7f0;
  long local_7e8;
  long *local_7d8;
  int local_7cc;
  int local_7c8;
  long local_7b8;
  int local_7ac;
  int local_7a0;
  int local_79c;
  long *local_798;
  undefined8 *local_788;
  undefined8 *local_778;
  undefined8 *local_768;
  undefined8 *local_758;
  undefined8 *local_748;
  undefined8 *local_738;
  undefined8 *local_728;
  undefined8 *local_718;
  undefined8 *local_708;
  void **local_6f8;
  int local_6d8;
  undefined4 local_6d4;
  void **local_6d0;
  undefined8 *local_6b0;
  undefined8 *local_690;
  undefined8 *local_670;
  undefined8 *local_650;
  undefined8 *local_630;
  undefined8 *local_610;
  undefined8 *local_5f0;
  undefined8 *local_5d0;
  undefined8 *local_5b0;
  undefined1 local_5a5;
  int local_5a4;
  undefined8 *local_598;
  undefined1 local_575;
  int local_574;
  void **local_570;
  undefined8 *local_568;
  undefined1 local_545;
  int local_544;
  void **local_540;
  undefined8 *local_538;
  undefined1 local_515;
  int local_514;
  void **local_510;
  undefined8 *local_508;
  undefined1 local_4e5;
  int local_4e4;
  void **local_4e0;
  undefined8 *local_4d8;
  undefined1 local_4b5;
  int local_4b4;
  void **local_4b0;
  undefined8 *local_4a8;
  undefined1 local_485;
  int local_484;
  void **local_480;
  undefined8 *local_478;
  undefined1 local_455;
  int local_454;
  void **local_450;
  undefined8 *local_448;
  undefined1 local_425;
  int local_424;
  void **local_420;
  undefined8 *local_418;
  undefined8 *local_3f8;
  int local_3ec;
  undefined8 *local_3e8;
  int local_3dc;
  undefined8 *local_3d8;
  int local_3cc;
  undefined8 *local_3c8;
  int local_3bc;
  undefined8 *local_3b8;
  int local_3ac;
  undefined8 *local_3a8;
  int local_39c;
  undefined8 *local_398;
  int local_38c;
  undefined8 *local_388;
  int local_37c;
  undefined8 *local_378;
  void *local_270;
  undefined8 *local_258;
  void *local_238;
  undefined8 *local_220;
  void *local_200;
  undefined8 *local_1e8;
  void *local_1c8;
  undefined8 *local_1b0;
  void *local_190;
  undefined8 *local_178;
  void *local_158;
  undefined8 *local_140;
  void *local_120;
  undefined8 *local_108;
  void *local_e8;
  undefined8 *local_d0;
  long local_c8;
  undefined4 local_bc;
  long local_b8;
  undefined4 *local_b0;
  undefined4 local_a4;
  int local_a0;
  int local_9c;
  undefined8 *local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  _c = (int)((ulong)in_stack_fffffffffffff3c0 >> 0x20);
  local_7ac = in_R8D * in_R9D;
  local_7a0 = in_ECX;
  local_79c = in_EDX;
  local_798 = in_RSI;
  Mat::reshape(in_stack_fffffffffffff4a8,(int)((ulong)in_stack_fffffffffffff4a0 >> 0x20),
               (int)in_stack_fffffffffffff4a0,(int)((ulong)in_stack_fffffffffffff498 >> 0x20),
               in_stack_fffffffffffff490);
  Mat::create(in_stack_fffffffffffff3d0,(int)((ulong)in_stack_fffffffffffff3c8 >> 0x20),
              (int)in_stack_fffffffffffff3c8,_c,in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b0)
  ;
  for (local_808 = 0; local_808 + 7 < local_7a0; local_808 = local_808 + 8) {
    local_418 = &local_850;
    local_420 = &local_7f8;
    local_270 = (void *)((long)local_7f8 + local_7b8 * local_808 * local_7e8);
    local_258 = &local_850;
    local_8 = (long)local_7cc * (long)local_7c8 * local_7e8;
    local_454 = local_808 + 1;
    local_448 = &local_898;
    local_450 = &local_7f8;
    local_238 = (void *)((long)local_7f8 + local_7b8 * local_454 * local_7e8);
    local_220 = &local_898;
    local_18 = (long)local_7cc * (long)local_7c8 * local_7e8;
    local_484 = local_808 + 2;
    local_478 = &local_8e0;
    local_480 = &local_7f8;
    local_200 = (void *)((long)local_7f8 + local_7b8 * local_484 * local_7e8);
    local_1e8 = &local_8e0;
    local_28 = (long)local_7cc * (long)local_7c8 * local_7e8;
    local_4b4 = local_808 + 3;
    local_4a8 = &local_928;
    local_4b0 = &local_7f8;
    local_1c8 = (void *)((long)local_7f8 + local_7b8 * local_4b4 * local_7e8);
    local_1b0 = &local_928;
    local_38 = (long)local_7cc * (long)local_7c8 * local_7e8;
    local_4e4 = local_808 + 4;
    local_4d8 = &local_970;
    local_4e0 = &local_7f8;
    local_190 = (void *)((long)local_7f8 + local_7b8 * local_4e4 * local_7e8);
    local_178 = &local_970;
    local_48 = (long)local_7cc * (long)local_7c8 * local_7e8;
    local_514 = local_808 + 5;
    local_508 = &local_9b8;
    local_510 = &local_7f8;
    local_158 = (void *)((long)local_7f8 + local_7b8 * local_514 * local_7e8);
    local_140 = &local_9b8;
    local_58 = (long)local_7cc * (long)local_7c8 * local_7e8;
    local_544 = local_808 + 6;
    local_538 = &local_a00;
    local_540 = &local_7f8;
    local_120 = (void *)((long)local_7f8 + local_7b8 * local_544 * local_7e8);
    local_108 = &local_a00;
    local_68 = (long)local_7cc * (long)local_7c8 * local_7e8;
    local_574 = local_808 + 7;
    local_568 = &local_a48;
    local_570 = &local_7f8;
    local_e8 = (void *)((long)local_7f8 + local_7b8 * local_574 * local_7e8);
    local_d0 = &local_a48;
    local_78 = (long)local_7cc * (long)local_7c8 * local_7e8;
    local_5a4 = local_808 / 8;
    local_598 = &local_a98;
    local_9c = *(int *)((long)local_798 + 0x2c);
    local_a0 = (int)local_798[6];
    local_a4 = *(undefined4 *)((long)local_798 + 0x34);
    local_b0 = (undefined4 *)(*local_798 + local_798[8] * (long)local_5a4 * local_798[2]);
    local_b8 = local_798[2];
    local_bc = (undefined4)local_798[3];
    local_c8 = local_798[4];
    local_98 = &local_a98;
    local_88 = (long)local_9c * (long)local_a0 * local_b8;
    local_3f8 = &local_a98;
    local_788 = &local_a98;
    local_a50 = local_b0;
    for (local_a9c = 0; local_a9c < local_79c; local_a9c = local_a9c + 1) {
      local_378 = &local_850;
      local_37c = local_a9c;
      local_388 = &local_898;
      local_38c = local_a9c;
      local_398 = &local_8e0;
      local_39c = local_a9c;
      local_3a8 = &local_928;
      local_3ac = local_a9c;
      local_3b8 = &local_970;
      local_3bc = local_a9c;
      local_3c8 = &local_9b8;
      local_3cc = local_a9c;
      local_3d8 = &local_a00;
      local_3dc = local_a9c;
      local_3e8 = &local_a48;
      local_3ec = local_a9c;
      for (local_ae4 = 0; local_ae4 < local_7ac; local_ae4 = local_ae4 + 1) {
        *local_a50 = *(undefined4 *)
                      ((long)local_270 +
                      (long)local_ae4 * 4 + (long)local_7cc * (long)local_a9c * local_7e8);
        local_a50[1] = *(undefined4 *)
                        ((long)local_238 +
                        (long)local_ae4 * 4 + (long)local_7cc * (long)local_a9c * local_7e8);
        local_a50[2] = *(undefined4 *)
                        ((long)local_200 +
                        (long)local_ae4 * 4 + (long)local_7cc * (long)local_a9c * local_7e8);
        local_a50[3] = *(undefined4 *)
                        ((long)local_1c8 +
                        (long)local_ae4 * 4 + (long)local_7cc * (long)local_a9c * local_7e8);
        local_a50[4] = *(undefined4 *)
                        ((long)local_190 +
                        (long)local_ae4 * 4 + (long)local_7cc * (long)local_a9c * local_7e8);
        local_a50[5] = *(undefined4 *)
                        ((long)local_158 +
                        (long)local_ae4 * 4 + (long)local_7cc * (long)local_a9c * local_7e8);
        local_a50[6] = *(undefined4 *)
                        ((long)local_120 +
                        (long)local_ae4 * 4 + (long)local_7cc * (long)local_a9c * local_7e8);
        local_a50[7] = *(undefined4 *)
                        ((long)local_e8 +
                        (long)local_ae4 * 4 + (long)local_7cc * (long)local_a9c * local_7e8);
        local_a50 = local_a50 + 8;
      }
    }
    local_778 = &local_a48;
    local_768 = &local_a00;
    local_758 = &local_9b8;
    local_748 = &local_970;
    local_738 = &local_928;
    local_728 = &local_8e0;
    local_718 = &local_898;
    local_8ac = 0;
    local_8d8 = 0;
    local_8e0 = 0;
    local_8f4 = 0;
    local_920 = 0;
    local_928 = 0;
    local_93c = 0;
    local_968 = 0;
    local_970 = 0;
    local_984 = 0;
    local_9b0 = 0;
    local_9b8 = 0;
    local_9c8 = 0;
    local_9cc = 0;
    local_9d0 = 0;
    local_9d4 = 0;
    local_9e8 = 0;
    local_9f0 = 0;
    local_9f8 = 0;
    local_a00 = 0;
    local_a10 = 0;
    local_a14 = 0;
    local_a18 = 0;
    local_a1c = 0;
    local_a30 = 0;
    local_a38 = 0;
    local_a40 = 0;
    local_a48 = 0;
    local_a60 = 0;
    local_a64 = 0;
    local_a68 = 0;
    local_a6c = 0;
    local_a80 = 0;
    local_a88 = 0;
    local_a90 = 0;
    local_a98 = 0;
    local_c = 0x10;
    local_1c = 0x10;
    local_2c = 0x10;
    local_3c = 0x10;
    local_4c = 0x10;
    local_5c = 0x10;
    local_6c = 0x10;
    local_7c = 0x10;
    local_8c = 0x10;
    local_424 = local_808;
    local_425 = 1;
    local_455 = 1;
    local_485 = 1;
    local_4b5 = 1;
    local_4e5 = 1;
    local_515 = 1;
    local_545 = 1;
    local_575 = 1;
    local_5a5 = 1;
    local_8a0 = 0;
    local_8b8 = 0;
    local_8e8 = 0;
    local_900 = 0;
    local_930 = 0;
    local_948 = 0;
    local_978 = 0;
    local_990 = 0;
    local_9c0 = 0;
    local_9d8 = 0;
    local_a08 = 0;
    local_a20 = 0;
    local_a58 = 0;
    local_a70 = 0;
    local_898 = 0;
    local_870 = 0;
    local_864 = 0;
    local_858 = 0;
    local_890 = 0;
    local_708 = &local_850;
    local_850 = 0;
    local_840 = 0;
    local_838 = 0;
    local_828 = 0;
    local_824 = 0;
    local_820 = 0;
    local_81c = 0;
    local_818 = 0;
    local_810 = 0;
    local_848 = 0;
    local_6b0 = local_708;
    local_690 = local_718;
    local_670 = local_728;
    local_650 = local_738;
    local_630 = local_748;
    local_610 = local_758;
    local_5f0 = local_768;
    local_5d0 = local_778;
    local_5b0 = local_788;
    local_a78 = local_c8;
  }
  local_6f8 = &local_7f8;
  if (local_7f0 != (int *)0x0) {
    local_6d4 = 0xffffffff;
    LOCK();
    local_6d8 = *local_7f0;
    *local_7f0 = *local_7f0 + -1;
    UNLOCK();
    if (local_6d8 == 1) {
      local_6d0 = local_6f8;
      if (local_7d8 == (long *)0x0) {
        if (local_7f8 != (void *)0x0) {
          free(local_7f8);
        }
      }
      else {
        (**(code **)(*local_7d8 + 0x18))(local_7d8,local_7f8);
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack1to8_avx(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 8b-4a-maxk-inch/4a-outch/8b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(8 * maxk, inch, outch / 8);

    int q = 0;
    for (; q + 7 < outch; q += 8)
    {
        const Mat k0 = kernel.channel(q);
        const Mat k1 = kernel.channel(q + 1);
        const Mat k2 = kernel.channel(q + 2);
        const Mat k3 = kernel.channel(q + 3);
        const Mat k4 = kernel.channel(q + 4);
        const Mat k5 = kernel.channel(q + 5);
        const Mat k6 = kernel.channel(q + 6);
        const Mat k7 = kernel.channel(q + 7);

        float* g00 = kernel_tm.channel(q / 8);

        for (int p = 0; p < inch; p++)
        {
            const float* k00 = k0.row(p);
            const float* k10 = k1.row(p);
            const float* k20 = k2.row(p);
            const float* k30 = k3.row(p);
            const float* k40 = k4.row(p);
            const float* k50 = k5.row(p);
            const float* k60 = k6.row(p);
            const float* k70 = k7.row(p);

            for (int k = 0; k < maxk; k++)
            {
                g00[0] = k00[k];
                g00[1] = k10[k];
                g00[2] = k20[k];
                g00[3] = k30[k];
                g00[4] = k40[k];
                g00[5] = k50[k];
                g00[6] = k60[k];
                g00[7] = k70[k];

                g00 += 8;
            }
        }
    }
}